

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O0

bool __thiscall aeron::Subscription::hasImage(Subscription *this,int64_t correlationId)

{
  ulong uVar1;
  Image *pIVar2;
  ImageList *pIVar3;
  int64_t iVar4;
  long in_RSI;
  size_t i;
  bool isConnected;
  Image *images;
  size_t length;
  ImageList *imageList;
  undefined8 in_stack_ffffffffffffffc8;
  ulong uVar5;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar6;
  
  pIVar3 = std::atomic_load_explicit<aeron::ImageList*>
                     ((atomic<aeron::ImageList_*> *)
                      CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                      (memory_order)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  uVar1 = pIVar3->m_length;
  pIVar2 = pIVar3->m_images;
  bVar6 = 0;
  uVar5 = 0;
  do {
    if (uVar1 <= uVar5) {
LAB_0020c24c:
      return (bool)(bVar6 & 1);
    }
    iVar4 = Image::correlationId(pIVar2 + uVar5);
    if (iVar4 == in_RSI) {
      bVar6 = 1;
      goto LAB_0020c24c;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool hasImage(std::int64_t correlationId) const
    {
        const struct ImageList *imageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        const std::size_t length = imageList->m_length;
        Image *images = imageList->m_images;
        bool isConnected = false;

        for (std::size_t i = 0; i < length; i++)
        {
            if (images[i].correlationId() == correlationId)
            {
                isConnected = true;
                break;
            }
        }

        return isConnected;
    }